

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  uint uVar1;
  short sVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  FSE_CTable FVar7;
  FSE_CTable FVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  
  uVar6 = 1 << ((byte)tableLog & 0x1f);
  uVar11 = 1;
  if (tableLog != 0) {
    uVar11 = (ulong)(uVar6 >> 1);
  }
  sVar4 = 0xffffffffffffffff;
  if (((ulong)workSpace & 3) == 0) {
    uVar14 = maxSymbolValue + 2;
    uVar12 = (ulong)uVar14;
    sVar4 = 0xffffffffffffffd4;
    if (((1L << ((byte)tableLog - 2 & 0x3f)) + uVar12) * 4 <= wkspSize) {
      uVar1 = uVar6 - 1;
      *(short *)ct = (short)tableLog;
      *(short *)((long)ct + 2) = (short)maxSymbolValue;
      *(undefined4 *)workSpace = 0;
      uVar5 = maxSymbolValue + 1;
      uVar9 = uVar1;
      if (uVar5 != 0) {
        uVar13 = 2;
        if (2 < uVar14) {
          uVar13 = (ulong)uVar14;
        }
        lVar16 = 0;
        uVar18 = (ulong)uVar1;
        do {
          if (normalizedCounter[lVar16] == -1) {
            *(int *)((long)workSpace + lVar16 * 4 + 4) = *(int *)((long)workSpace + lVar16 * 4) + 1;
            uVar10 = (ulong)((int)uVar18 - 1);
            *(char *)((long)workSpace + uVar18 + uVar12 * 4) = (char)lVar16;
          }
          else {
            *(int *)((long)workSpace + lVar16 * 4 + 4) =
                 (int)normalizedCounter[lVar16] + *(int *)((long)workSpace + lVar16 * 4);
            uVar10 = uVar18;
          }
          uVar9 = (uint)uVar10;
          lVar16 = lVar16 + 1;
          uVar18 = uVar10;
        } while (uVar13 - 1 != lVar16);
      }
      *(uint *)((long)workSpace + (ulong)uVar5 * 4) = uVar6 + 1;
      uVar13 = (ulong)(uVar5 + (uVar5 == 0));
      uVar18 = 0;
      uVar14 = 0;
      do {
        sVar2 = normalizedCounter[uVar18];
        if (0 < sVar2) {
          iVar15 = 0;
          do {
            *(char *)((long)workSpace + (ulong)uVar14 + uVar12 * 4) = (char)uVar18;
            do {
              uVar14 = uVar14 + (uVar6 >> 3) + (uVar6 >> 1) + 3 & uVar1;
            } while (uVar9 < uVar14);
            iVar15 = iVar15 + 1;
          } while (iVar15 != sVar2);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 != uVar13);
      uVar18 = 0;
      do {
        uVar10 = (ulong)*(byte *)((long)workSpace + uVar18 + uVar12 * 4);
        uVar14 = *(uint *)((long)workSpace + uVar10 * 4);
        *(uint *)((long)workSpace + uVar10 * 4) = uVar14 + 1;
        *(short *)((long)ct + (ulong)uVar14 * 2 + 4) = (short)uVar6 + (short)uVar18;
        uVar18 = uVar18 + 1;
      } while (uVar6 != uVar18);
      FVar8 = tableLog * 0x10000 - uVar6;
      sVar4 = 0;
      uVar12 = 0;
      iVar15 = 0;
      do {
        sVar2 = normalizedCounter[uVar12];
        if ((sVar2 == -1) || (sVar2 == 1)) {
          ct[uVar11 + uVar12 * 2 + 2] = FVar8;
          ct[uVar11 + uVar12 * 2 + 1] = iVar15 - 1;
          iVar15 = iVar15 + 1;
        }
        else if (sVar2 == 0) {
          ct[uVar11 + uVar12 * 2 + 2] = FVar8 + 0x10000;
        }
        else {
          iVar17 = (int)sVar2;
          iVar3 = 0x1f;
          if (iVar17 - 1U != 0) {
            for (; iVar17 - 1U >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          FVar7 = iVar15 - iVar17;
          iVar15 = iVar15 + iVar17;
          ct[uVar11 + uVar12 * 2 + 2] =
               (tableLog - iVar3) * 0x10000 - (iVar17 << ((byte)(tableLog - iVar3) & 0x1f));
          ct[uVar11 + uVar12 * 2 + 1] = FVar7;
        }
        uVar12 = uVar12 + 1;
      } while (uVar13 != uVar12);
    }
  }
  return sVar4;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);

    U32* cumul = (U32*)workSpace;
    FSE_FUNCTION_TYPE* tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSymbolValue + 2));

    U32 highThreshold = tableSize-1;

    if ((size_t)workSpace & 3) return ERROR(GENERIC); /* Must be 4 byte aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * http://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSymbolValue+1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                cumul[u] = cumul[u-1] + normalizedCounter[u-1];
        }   }
        cumul[maxSymbolValue+1] = tableSize+1;
    }

    /* Spread symbols */
    {   U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }

        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                symbolTT[s].deltaFindState = total - 1;
                total ++;
                break;
            default :
                {
                    U32 const maxBitsOut = tableLog - BIT_highbit32 (normalizedCounter[s]-1);
                    U32 const minStatePlus = normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = total - normalizedCounter[s];
                    total +=  normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
        }
    }
#endif

    return 0;
}